

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icon.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  GLFWwindow *window;
  char **argv_local;
  int argc_local;
  
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    fprintf(_stderr,"Failed to initialize GLFW\n");
    exit(1);
  }
  handle = glfwCreateWindow(200,200,"Window Icon",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    glfwTerminate();
    fprintf(_stderr,"Failed to open GLFW window\n");
    exit(1);
  }
  glfwMakeContextCurrent(handle);
  gladLoadGL(glfwGetProcAddress);
  glfwSetKeyCallback(handle,key_callback);
  set_icon(handle,cur_icon_color);
  while( true ) {
    iVar1 = glfwWindowShouldClose(handle);
    if (iVar1 != 0) break;
    (*glad_glClear)(0x4000);
    glfwSwapBuffers(handle);
    glfwWaitEvents();
  }
  glfwDestroyWindow(handle);
  glfwTerminate();
  exit(0);
}

Assistant:

int main(int argc, char** argv)
{
    GLFWwindow* window;

    if (!glfwInit())
    {
        fprintf(stderr, "Failed to initialize GLFW\n");
        exit(EXIT_FAILURE);
    }

    window = glfwCreateWindow(200, 200, "Window Icon", NULL, NULL);
    if (!window)
    {
        glfwTerminate();

        fprintf(stderr, "Failed to open GLFW window\n");
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);

    glfwSetKeyCallback(window, key_callback);
    set_icon(window, cur_icon_color);

    while (!glfwWindowShouldClose(window))
    {
        glClear(GL_COLOR_BUFFER_BIT);
        glfwSwapBuffers(window);
        glfwWaitEvents();
    }

    glfwDestroyWindow(window);
    glfwTerminate();
    exit(EXIT_SUCCESS);
}